

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

string * __thiscall
soul::Program::ProgramImpl::getFullyQualifiedTypeDescription_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Type *type)

{
  anon_class_8_1_8991fb9c local_48;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  local_40;
  Type *local_20;
  Type *type_local;
  ProgramImpl *this_local;
  
  local_48.this = this;
  local_20 = type;
  type_local = (Type *)this;
  this_local = (ProgramImpl *)__return_storage_ptr__;
  std::function<std::__cxx11::string(soul::Structure_const&)>::
  function<soul::Program::ProgramImpl::getFullyQualifiedTypeDescription(soul::Type_const&)const::_lambda(soul::Structure_const&)_1_,void>
            ((function<std::__cxx11::string(soul::Structure_const&)> *)&local_40,&local_48);
  Type::getDescription(__return_storage_ptr__,type,&local_40);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  ::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getFullyQualifiedTypeDescription (const Type& type) const
    {
        return type.getDescription ([this] (const Structure& s) { return getStructNameWithQualificationIfNeeded ({}, s); });
    }